

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetGXToolInfo(ndicapi *pol,int port)

{
  unsigned_long uVar1;
  char (*string) [12];
  
  if (port - 0x31U < 3) {
    string = pol->GxInformation + (port - 0x31U);
  }
  else {
    if (8 < port - 0x41U) {
      return 0;
    }
    string = pol->GxPassiveInformation + (port - 0x41U);
  }
  uVar1 = ndiHexToUnsignedLong(*string,2);
  return (int)uVar1;
}

Assistant:

ndicapiExport int ndiGetGXToolInfo(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->GxInformation[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->GxPassiveInformation[port - 'A'];
  }
  else
  {
    return 0;
  }

  return (int)ndiHexToUnsignedLong(dp, 2);
}